

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ReportsTransitiveMissingImports_LeafFirst_Test::TestBody
          (CommandLineInterfaceTest_ReportsTransitiveMissingImports_LeafFirst_Test *this)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view expected_substring;
  string_view contents;
  string_view contents_00;
  string_view contents_01;
  string local_38;
  
  name._M_str = "unused.proto";
  name._M_len = 0xc;
  contents._M_str = "syntax = \"proto2\";\nmessage Unused {}\n";
  contents._M_len = 0x25;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  name_00._M_str = "bar.proto";
  name_00._M_len = 9;
  contents_00._M_str = "syntax = \"proto2\";\nimport \"unused.proto\";\nmessage Bar {}\n";
  contents_00._M_len = 0x39;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  name_01._M_str = "foo.proto";
  name_01._M_len = 9;
  contents_01._M_str =
       "syntax = \"proto2\";\nimport \"bar.proto\";\nmessage Foo {\n  optional Bar bar = 1;\n}\n";
  contents_01._M_len = 0x4f;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_01,contents_01)
  ;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir bar.proto foo.proto","");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  expected_substring._M_str = "bar.proto:2:1: warning: Import unused.proto is unused.";
  expected_substring._M_len = 0x36;
  CommandLineInterfaceTester::ExpectWarningSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ReportsTransitiveMissingImports_LeafFirst) {
  CreateTempFile("unused.proto",
                 "syntax = \"proto2\";\n"
                 "message Unused {}\n");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "import \"unused.proto\";\n"
                 "message Bar {}\n");
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "import \"bar.proto\";\n"
                 "message Foo {\n"
                 "  optional Bar bar = 1;\n"
                 "}\n");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir bar.proto foo.proto");
  ExpectWarningSubstring(
      "bar.proto:2:1: warning: Import unused.proto is unused.");
}